

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int iVar1;
  ulong in_RSI;
  size_t i;
  secp256k1_fe dqy;
  secp256k1_fe dqx;
  secp256k1_fe dpy;
  secp256k1_fe dpx;
  secp256k1_ge gg;
  secp256k1_ge q;
  secp256k1_ge p;
  secp256k1_gej g2;
  secp256k1_gej *in_stack_fffffffffffffd48;
  undefined5 in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd55;
  byte in_stack_fffffffffffffd56;
  byte in_stack_fffffffffffffd57;
  ulong local_2a8;
  undefined1 local_2a0 [24];
  secp256k1_fe *in_stack_fffffffffffffd78;
  secp256k1_fe *in_stack_fffffffffffffd80;
  secp256k1_gej *in_stack_fffffffffffffda8;
  secp256k1_ge *in_stack_fffffffffffffdb0;
  undefined1 local_178 [48];
  undefined1 auStack_148 [56];
  undefined1 local_110 [256];
  ulong local_10;
  
  if (in_RSI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1024,"test condition failed: 0 < n");
    abort();
  }
  local_10 = in_RSI;
  secp256k1_ge_from_storage
            ((secp256k1_ge *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,
                               CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
             (secp256k1_ge_storage *)in_stack_fffffffffffffd48);
  iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffda8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1027,"test condition failed: secp256k1_ge_is_valid_var(&p)");
    abort();
  }
  secp256k1_gej_set_ge
            ((secp256k1_gej *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,
                               CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
             (secp256k1_ge *)in_stack_fffffffffffffd48);
  secp256k1_gej_double_var
            ((secp256k1_gej *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,
                               CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
             in_stack_fffffffffffffd48,(secp256k1_fe *)0x1438ab);
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_2a8 = 1;
  while( true ) {
    if (local_10 <= local_2a8) {
      return;
    }
    secp256k1_fe_negate_unchecked
              ((secp256k1_fe *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
               &in_stack_fffffffffffffd48->x,0);
    secp256k1_fe_add((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x);
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x14391a);
    secp256k1_fe_negate_unchecked
              ((secp256k1_fe *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
               &in_stack_fffffffffffffd48->x,0);
    secp256k1_fe_add((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x);
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x143955);
    iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x143962);
    in_stack_fffffffffffffd57 = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x143979);
      in_stack_fffffffffffffd57 = iVar1 != 0 ^ 0xff;
    }
    if (((in_stack_fffffffffffffd57 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1030,
              "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy)"
             );
      abort();
    }
    secp256k1_ge_from_storage
              ((secp256k1_ge *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
               (secp256k1_ge_storage *)in_stack_fffffffffffffd48);
    iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffda8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1033,"test condition failed: secp256k1_ge_is_valid_var(&q)");
      abort();
    }
    secp256k1_fe_negate_unchecked
              ((secp256k1_fe *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50))),
               &in_stack_fffffffffffffd48->x,0);
    secp256k1_fe_add((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x);
    memcpy(local_2a0,auStack_148,0x30);
    secp256k1_fe_add((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x);
    iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x143aa9);
    in_stack_fffffffffffffd56 = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x143ac0);
      in_stack_fffffffffffffd56 = iVar1 != 0 ^ 0xff;
    }
    if (((in_stack_fffffffffffffd56 ^ 0xff) & 1) != 0) break;
    iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd55 = 1;
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd55 = iVar1 != 0 ^ 0xff;
    }
    if (((in_stack_fffffffffffffd55 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x103b,
              "test condition failed: !secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy)"
             );
      abort();
    }
    secp256k1_fe_mul((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x,(secp256k1_fe *)0x143bab);
    secp256k1_fe_mul((secp256k1_fe *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,
                                       CONCAT15(in_stack_fffffffffffffd55,in_stack_fffffffffffffd50)
                                      )),&in_stack_fffffffffffffd48->x,(secp256k1_fe *)0x143bbd);
    iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1040,"test condition failed: secp256k1_fe_equal(&dpx, &dpy)");
      abort();
    }
    memcpy(local_110,local_178,0x68);
    local_2a8 = local_2a8 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1038,
          "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy)"
         );
  abort();
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}